

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

void __thiscall llvm::DWARFUnitIndex::dump(DWARFUnitIndex *this,raw_ostream *OS)

{
  char *pcVar1;
  Entry *pEVar2;
  tuple<llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
  tVar3;
  raw_ostream *this_00;
  undefined **__n;
  size_t __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  ulong uVar4;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  FormattedString local_50;
  uint local_38;
  
  local_50.Width = (this->Header).NumBuckets;
  if (local_50.Width != 0) {
    __n = &PTR_home_01098a18;
    local_50.Str.Length = (size_t)"version = %u slots = %u\n\n";
    local_50.Str.Data = (char *)&PTR_home_01098a18;
    local_50.Justify = (this->Header).Version;
    raw_ostream::operator<<(OS,(format_object_base *)&local_50);
    Str.Length = 0x18;
    Str.Data = "Index Signature         ";
    raw_ostream::operator<<(OS,Str);
    if ((this->Header).NumColumns != 0) {
      uVar4 = 0;
      pvVar5 = extraout_RDX;
      do {
        pcVar1 = OS->OutBufCur;
        if (pcVar1 < OS->OutBufEnd) {
          OS->OutBufCur = pcVar1 + 1;
          *pcVar1 = ' ';
          this_00 = OS;
        }
        else {
          this_00 = (raw_ostream *)raw_ostream::write(OS,0x20,pvVar5,(size_t)__n);
        }
        __n = (undefined **)
              (this->ColumnKinds)._M_t.
              super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
              .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl;
        local_50.Str = getColumnHeader(*(DWARFSectionKind *)((long)__n + uVar4 * 4));
        local_50.Width = 0x18;
        local_50.Justify = JustifyLeft;
        raw_ostream::operator<<(this_00,&local_50);
        uVar7 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar7;
        pvVar5 = extraout_RDX_00;
      } while (uVar7 != (this->Header).NumColumns);
    }
    Str_00.Length = 0x19;
    Str_00.Data = "\n----- ------------------";
    raw_ostream::operator<<(OS,Str_00);
    pvVar5 = extraout_RDX_01;
    if ((this->Header).NumColumns != 0) {
      uVar6 = 0;
      do {
        Str_01.Length = 0x19;
        Str_01.Data = " ------------------------";
        raw_ostream::operator<<(OS,Str_01);
        uVar6 = uVar6 + 1;
        pvVar5 = extraout_RDX_02;
      } while (uVar6 != (this->Header).NumColumns);
    }
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar1 + 1;
      *pcVar1 = '\n';
    }
    else {
      raw_ostream::write(OS,10,pvVar5,(size_t)__n);
    }
    if ((this->Header).NumBuckets != 0) {
      uVar4 = 0;
      do {
        pEVar2 = (this->Rows)._M_t.
                 super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
        tVar3.
        super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
        .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
        _M_head_impl = *(_Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                         *)&pEVar2[uVar4].Contributions._M_t.
                            super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
        ;
        if (tVar3.
            super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
            .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
            _M_head_impl !=
            (_Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>)0x0) {
          local_38 = (int)uVar4 + 1;
          __n_00 = (size_t)local_38;
          local_50.Str.Length = (size_t)"%5u 0x%016lx ";
          local_50.Str.Data = (char *)&PTR_home_01098010;
          local_50._16_8_ = pEVar2[uVar4].Signature;
          raw_ostream::operator<<(OS,(format_object_base *)&local_50);
          pvVar5 = extraout_RDX_03;
          if ((this->Header).NumColumns != 0) {
            uVar8 = 0;
            do {
              local_50.Justify =
                   *(uint *)((long)tVar3.
                                   super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                                   .
                                   super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>
                                   ._M_head_impl + uVar8 * 8);
              __n_00 = (size_t)local_50.Justify;
              local_50.Str.Length = (size_t)"[0x%08x, 0x%08x) ";
              local_50.Str.Data = (char *)&PTR_home_01098a18;
              local_50.Width =
                   *(int *)((long)tVar3.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                                  .
                                  super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>
                                  ._M_head_impl + 4 + uVar8 * 8) + local_50.Justify;
              raw_ostream::operator<<(OS,(format_object_base *)&local_50);
              uVar7 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar7;
              pvVar5 = extraout_RDX_04;
            } while (uVar7 != (this->Header).NumColumns);
          }
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(OS,10,pvVar5,__n_00);
          }
        }
        uVar7 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar7;
      } while (uVar7 != (this->Header).NumBuckets);
    }
  }
  return;
}

Assistant:

void DWARFUnitIndex::dump(raw_ostream &OS) const {
  if (!*this)
    return;

  Header.dump(OS);
  OS << "Index Signature         ";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << ' ' << left_justify(getColumnHeader(ColumnKinds[i]), 24);
  OS << "\n----- ------------------";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << " ------------------------";
  OS << '\n';
  for (unsigned i = 0; i != Header.NumBuckets; ++i) {
    auto &Row = Rows[i];
    if (auto *Contribs = Row.Contributions.get()) {
      OS << format("%5u 0x%016" PRIx64 " ", i + 1, Row.Signature);
      for (unsigned i = 0; i != Header.NumColumns; ++i) {
        auto &Contrib = Contribs[i];
        OS << format("[0x%08x, 0x%08x) ", Contrib.Offset,
                     Contrib.Offset + Contrib.Length);
      }
      OS << '\n';
    }
  }
}